

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_func_get_args(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  VmFrame *pVVar1;
  jx9_vm *pjVar2;
  jx9_value *pjVar3;
  jx9_value *pVal;
  uint *puVar4;
  ulong uVar5;
  
  pVVar1 = pCtx->pVm->pFrame;
  if (pVVar1->pParent == (VmFrame *)0x0) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Called in the global scope");
  }
  else {
    pjVar3 = jx9_context_new_array(pCtx);
    if (pjVar3 != (jx9_value *)0x0) {
      if ((pVVar1->sArg).nUsed != 0) {
        puVar4 = (uint *)(pVVar1->sArg).pBase;
        uVar5 = 0;
        do {
          pjVar2 = pCtx->pVm;
          if (*puVar4 < (pjVar2->aMemObj).nUsed) {
            pVal = (jx9_value *)
                   ((ulong)(*puVar4 * (pjVar2->aMemObj).eSize) + (long)(pjVar2->aMemObj).pBase);
          }
          else {
            pVal = (jx9_value *)0x0;
          }
          if ((pVal != (jx9_value *)0x0) && ((pjVar3->iFlags & 0x40) != 0)) {
            HashmapInsert((jx9_hashmap *)(pjVar3->x).pOther,(jx9_value *)0x0,pVal);
          }
          uVar5 = uVar5 + 1;
          puVar4 = puVar4 + 4;
        } while (uVar5 < (pVVar1->sArg).nUsed);
      }
      jx9MemObjStore(pjVar3,pCtx->pRet);
      return 0;
    }
  }
  pjVar3 = pCtx->pRet;
  jx9MemObjRelease(pjVar3);
  (pjVar3->x).rVal = 0.0;
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int vm_builtin_func_get_args(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pObj = 0;
	jx9_value *pArray;
	VmFrame *pFrame;
	VmSlot *aSlot;
	sxu32 n;
	/* Point to the current frame */
	pFrame = pCtx->pVm->pFrame;
	if( pFrame->pParent == 0 ){
		/* Global frame, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Called in the global scope");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Start filling the array with the given arguments */
	aSlot = (VmSlot *)SySetBasePtr(&pFrame->sArg);
	for( n = 0;  n < SySetUsed(&pFrame->sArg) ; n++ ){
		pObj = (jx9_value *)SySetAt(&pCtx->pVm->aMemObj, aSlot[n].nIdx);
		if( pObj ){
			jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pObj);
		}
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}